

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O1

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  UInt32 UVar5;
  undefined4 uVar6;
  bool bVar7;
  Bool BVar8;
  uint uVar9;
  UInt32 UVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  Int32 *pIVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  UInt32 *pUVar21;
  EState *pEVar22;
  UInt32 *pUVar23;
  int iVar24;
  UInt32 *pUVar25;
  UInt32 *eclass;
  int iVar26;
  uint uVar27;
  byte bVar28;
  UInt16 UVar29;
  Int32 in_R8D;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ushort uVar33;
  Int32 zztmp_1;
  uint uVar34;
  int iVar35;
  uint uVar36;
  Int32 zztmp;
  byte *pbVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  Int32 budget;
  Bool bigDone [256];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  Int32 copyEnd [256];
  Int32 copyStart [256];
  int local_12bc;
  UInt32 *local_12b8;
  byte *local_12b0;
  ulong local_12a8;
  ulong local_12a0;
  long local_1298;
  ulong local_1290;
  int local_1284;
  int local_1280;
  int local_127c;
  long local_1278;
  long local_1270;
  ulong local_1268;
  UInt16 *local_1260;
  EState *local_1258;
  ulong local_1250;
  int local_1244;
  int local_1240;
  int local_123c;
  ulong local_1238;
  long local_1230;
  ulong local_1228;
  UInt32 *local_1220;
  UInt32 *local_1218;
  UInt32 *local_1210;
  UInt32 *local_1208;
  ulong local_1200;
  ulong local_11f8;
  ulong local_11f0;
  char local_11e8 [256];
  int local_10e8 [100];
  uint local_f58 [100];
  uint local_dc8 [100];
  uint auStack_c38 [512];
  uint auStack_438 [258];
  
  pUVar21 = s->ftab;
  pUVar23 = s->ptr;
  uVar12 = s->nblock;
  uVar39 = (ulong)(int)uVar12;
  local_1258 = s;
  if ((long)uVar39 < 10000) {
    pUVar25 = s->arr1;
    eclass = s->arr2;
  }
  else {
    pbVar37 = s->block;
    lVar19 = (ulong)uVar12 + (ulong)(uVar12 & 1);
    local_12b0 = (byte *)((ulong)(uVar12 & 1) + (ulong)uVar12 + 0x22);
    iVar11 = 1;
    if (1 < s->workFactor) {
      iVar11 = s->workFactor;
    }
    iVar20 = 100;
    if (iVar11 < 100) {
      iVar20 = iVar11;
    }
    local_12bc = ((iVar20 - 1U) / 3) * uVar12;
    memset(pUVar21,0,0x40004);
    bVar28 = *pbVar37;
    local_1238 = (ulong)(uVar12 - 1);
    lVar16 = local_1238 + 4;
    uVar18 = local_1238;
    do {
      (pbVar37 + lVar16 * 2 + lVar19 + 0x1a)[0] = 0;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x1a)[1] = 0;
      bVar3 = pbVar37[lVar16 + -4];
      pUVar21[CONCAT11(bVar3,bVar28)] = pUVar21[CONCAT11(bVar3,bVar28)] + 1;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x18)[0] = 0;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x18)[1] = 0;
      bVar28 = pbVar37[lVar16 + -5];
      piVar1 = (int *)((long)pUVar21 + (ulong)((uint)bVar28 * 0x400 + (uint)bVar3 * 4));
      *piVar1 = *piVar1 + 1;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x16)[0] = 0;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x16)[1] = 0;
      bVar3 = pbVar37[lVar16 + -6];
      piVar1 = (int *)((long)pUVar21 + (ulong)((uint)bVar3 * 0x400 + (uint)bVar28 * 4));
      *piVar1 = *piVar1 + 1;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x14)[0] = 0;
      (pbVar37 + lVar16 * 2 + lVar19 + 0x14)[1] = 0;
      bVar28 = pbVar37[lVar16 + -7];
      uVar32 = (ulong)CONCAT11(bVar28,bVar3);
      pUVar21[uVar32] = pUVar21[uVar32] + 1;
      uVar9 = (int)uVar18 - 4;
      uVar18 = (ulong)uVar9;
      lVar16 = lVar16 + -4;
    } while (6 < lVar16);
    if (3 < lVar16) {
      lVar16 = (ulong)uVar9 + 1;
      do {
        (pbVar37 + lVar16 * 2 + (long)local_12b0 + -2)[0] = 0;
        (pbVar37 + lVar16 * 2 + (long)local_12b0 + -2)[1] = 0;
        uVar32 = (ulong)((uint)pbVar37[lVar16 + -1] << 8 | (uint)(uVar32 >> 8));
        pUVar21[uVar32] = pUVar21[uVar32] + 1;
        lVar13 = lVar16 + -1;
        bVar7 = 0 < lVar16;
        lVar16 = lVar13;
      } while (lVar13 != 0 && bVar7);
    }
    lVar16 = 0;
    do {
      pbVar37[lVar16 + uVar39] = pbVar37[lVar16];
      (pbVar37 + lVar16 * 2 + (long)local_12b0 + uVar39 * 2)[0] = 0;
      (pbVar37 + lVar16 * 2 + (long)local_12b0 + uVar39 * 2)[1] = 0;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x22);
    UVar10 = *pUVar21;
    lVar16 = 1;
    do {
      UVar10 = UVar10 + pUVar21[lVar16];
      pUVar21[lVar16] = UVar10;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10001);
    uVar33 = (ushort)*pbVar37 << 8;
    iVar11 = -1;
    iVar20 = -4;
    iVar24 = -3;
    iVar26 = -2;
    uVar18 = local_1238;
    do {
      uVar32 = uVar18;
      bVar28 = pbVar37[uVar32];
      uVar33 = (ushort)bVar28 << 8 | uVar33 >> 8;
      UVar10 = pUVar21[uVar33];
      pUVar21[uVar33] = UVar10 - 1;
      pUVar23[(int)(UVar10 - 1)] = uVar12 + iVar11;
      bVar3 = pbVar37[uVar32 - 1];
      uVar33 = CONCAT11(bVar3,bVar28);
      UVar10 = pUVar21[uVar33];
      pUVar21[uVar33] = UVar10 - 1;
      pUVar23[(int)(UVar10 - 1)] = uVar12 + iVar26;
      bVar28 = pbVar37[uVar32 - 2];
      uVar33 = CONCAT11(bVar28,bVar3);
      UVar10 = pUVar21[uVar33];
      pUVar21[uVar33] = UVar10 - 1;
      pUVar23[(int)(UVar10 - 1)] = uVar12 + iVar24;
      uVar33 = CONCAT11(pbVar37[uVar32 - 3],bVar28);
      UVar10 = pUVar21[uVar33];
      pUVar21[uVar33] = UVar10 - 1;
      pUVar23[(int)(UVar10 - 1)] = uVar12 + iVar20;
      iVar11 = iVar11 + -4;
      iVar20 = iVar20 + -4;
      iVar24 = iVar24 + -4;
      iVar26 = iVar26 + -4;
      uVar18 = uVar32 - 4;
    } while (6 < (long)uVar32);
    if (3 < (long)uVar32) {
      uVar12 = iVar11 + uVar12;
      lVar16 = (ulong)uVar12 + 1;
      do {
        uVar33 = uVar33 >> 8 | (ushort)pbVar37[lVar16 + -1] << 8;
        UVar10 = pUVar21[uVar33];
        pUVar21[uVar33] = UVar10 - 1;
        pUVar23[(int)(UVar10 - 1)] = uVar12;
        uVar12 = uVar12 - 1;
        lVar13 = lVar16 + -1;
        bVar7 = 0 < lVar16;
        lVar16 = lVar13;
      } while (lVar13 != 0 && bVar7);
    }
    lVar16 = 0;
    local_12b8 = pUVar23;
    local_1290 = uVar39;
    local_1260 = (UInt16 *)(pbVar37 + lVar19 + 0x22);
    memset(local_11e8,0,0x100);
    uVar12 = 0;
    uVar9 = 1;
    uVar40 = 2;
    uVar41 = 3;
    do {
      auStack_c38[lVar16] = uVar12;
      auStack_c38[lVar16 + 1] = uVar9;
      auStack_c38[lVar16 + 2] = uVar40;
      auStack_c38[lVar16 + 3] = uVar41;
      lVar16 = lVar16 + 4;
      uVar12 = uVar12 + 4;
      uVar9 = uVar9 + 4;
      uVar40 = uVar40 + 4;
      uVar41 = uVar41 + 4;
    } while (lVar16 != 0x100);
    iVar11 = 0x16c;
    do {
      iVar20 = iVar11 / 3;
      if (iVar11 < 0x300) {
        uVar39 = (ulong)iVar20;
        iVar24 = 0xff;
        if (0xff < iVar20) {
          iVar24 = iVar20;
        }
        iVar26 = 0;
        do {
          uVar12 = auStack_c38[uVar39];
          uVar32 = (ulong)uVar12;
          UVar10 = pUVar21[(int)(uVar12 * 0x100 + 0x100)];
          UVar5 = pUVar21[(int)(uVar12 * 0x100)];
          iVar30 = iVar26;
          do {
            iVar35 = iVar20 + iVar30;
            iVar38 = auStack_c38[iVar30] * 0x100;
            if (pUVar21[iVar38 + 0x100] - pUVar21[iVar38] <= UVar10 - UVar5) goto LAB_0010c68c;
            auStack_c38[iVar35] = auStack_c38[iVar30];
            iVar35 = iVar30 - iVar20;
            bVar7 = iVar20 <= iVar30;
            iVar30 = iVar35;
          } while (bVar7);
          iVar35 = iVar35 + iVar20;
LAB_0010c68c:
          auStack_c38[iVar35] = uVar12;
          uVar39 = uVar39 + 1;
          iVar26 = iVar26 + 1;
        } while (uVar39 != iVar24 + 1);
      }
      uVar12 = iVar11 - 3;
      iVar11 = iVar20;
    } while (2 < uVar12);
    local_1210 = pUVar21 + 1;
    local_1218 = local_12b8 + -1;
    local_1278 = 0;
    pUVar23 = local_12b8;
    uVar39 = local_1290;
    local_12b0 = pbVar37;
    local_1220 = pUVar21;
    do {
      uVar18 = (ulong)auStack_c38[local_1278];
      local_1244 = auStack_c38[local_1278] << 8;
      local_1230 = (long)local_1244;
      pUVar25 = pUVar21 + local_1230;
      uVar17 = 0;
      local_1208 = pUVar25;
      local_1200 = uVar18;
      do {
        if (uVar17 != uVar18) {
          uVar12 = pUVar25[uVar17];
          if (((uVar12 >> 0x15 & 1) == 0) &&
             (uVar9 = (pUVar25[uVar17 + 1] & 0xffdfffff) - 1, (int)uVar12 < (int)uVar9)) {
            local_dc8[0] = uVar12;
            local_f58[0] = uVar9;
            local_10e8[0] = 2;
            local_12a8 = 1;
            bVar7 = true;
            local_11f8 = uVar17;
            do {
              local_1250 = (ulong)((int)local_12a8 - 1);
LAB_0010c78e:
              uVar39 = local_1250;
              if (0x61 < (uint)local_12a8) {
                bz_internal_error(0x3e9);
              }
              uVar12 = local_dc8[uVar39];
              local_1268 = (ulong)uVar12;
              uVar9 = local_f58[uVar39];
              lVar19 = (long)(int)uVar9;
              iVar11 = local_10e8[uVar39];
              iVar20 = uVar9 - uVar12;
              if ((iVar20 < 0x14) || (0xe < iVar11)) {
                if (0 < iVar20) {
                  local_1228 = 0xffffffffffffffff;
                  pIVar14 = incs;
                  do {
                    local_1228 = local_1228 + 1;
                    iVar24 = *pIVar14;
                    pIVar14 = pIVar14 + 1;
                  } while (iVar24 <= iVar20);
                  if (local_1228 != 0) {
                    local_123c = uVar12 + 1;
                    local_1240 = uVar12 + 2;
                    local_1270 = lVar19;
                    do {
                      local_11f0 = local_1228;
                      local_1228 = local_1228 - 1;
                      iVar20 = incs[local_1228 & 0xffffffff];
                      local_127c = (int)local_1268;
                      local_12a8 = CONCAT44(local_12a8._4_4_,iVar20 + local_127c);
                      lVar16 = (long)(iVar20 + local_127c);
                      local_1284 = local_1240;
                      local_1280 = local_123c;
                      while (lVar16 <= lVar19) {
                        uVar12 = pUVar23[lVar16];
                        local_12a0 = (ulong)uVar12;
                        iVar24 = local_127c;
                        local_1298 = lVar16;
                        do {
                          iVar26 = iVar20 + iVar24;
                          UVar10 = pUVar23[iVar24];
                          uVar32 = local_1290;
                          BVar8 = mainGtU(iVar11 + UVar10,uVar12 + iVar11,local_12b0,local_1260,
                                          (UInt32)local_1290,&local_12bc);
                          pUVar21 = local_12b8;
                          if (BVar8 == '\0') goto LAB_0010ca8b;
                          pUVar23[iVar26] = UVar10;
                          iVar26 = iVar24 - iVar20;
                          bVar7 = (int)(uint)local_12a8 <= iVar24;
                          iVar24 = iVar26;
                        } while (bVar7);
                        iVar26 = iVar26 + iVar20;
LAB_0010ca8b:
                        local_12b8[iVar26] = (UInt32)local_12a0;
                        pUVar23 = local_12b8;
                        lVar19 = local_1270;
                        if (local_1270 <= local_1298) break;
                        uVar12 = local_12b8[local_1298 + 1];
                        local_12a0 = (ulong)uVar12;
                        iVar24 = local_1280;
                        do {
                          iVar26 = iVar20 + iVar24;
                          UVar10 = pUVar21[iVar24];
                          uVar32 = local_1290;
                          BVar8 = mainGtU(iVar11 + UVar10,uVar12 + iVar11,local_12b0,local_1260,
                                          (UInt32)local_1290,&local_12bc);
                          pUVar23 = local_12b8;
                          if (BVar8 == '\0') goto LAB_0010cb11;
                          pUVar21[iVar26] = UVar10;
                          iVar26 = iVar24 - iVar20;
                          bVar7 = (int)(uint)local_12a8 <= iVar24;
                          iVar24 = iVar26;
                        } while (bVar7);
                        iVar26 = iVar26 + iVar20;
LAB_0010cb11:
                        local_12b8[iVar26] = (UInt32)local_12a0;
                        lVar19 = local_1270;
                        if (local_1270 < local_1298 + 2) break;
                        uVar12 = local_12b8[local_1298 + 2];
                        local_12a0 = (ulong)uVar12;
                        iVar24 = local_1284;
                        do {
                          iVar26 = iVar20 + iVar24;
                          UVar10 = pUVar23[iVar24];
                          uVar32 = local_1290;
                          BVar8 = mainGtU(iVar11 + UVar10,uVar12 + iVar11,local_12b0,local_1260,
                                          (UInt32)local_1290,&local_12bc);
                          if (BVar8 == '\0') goto LAB_0010cb9b;
                          pUVar23[iVar26] = UVar10;
                          iVar26 = iVar24 - iVar20;
                          bVar7 = (int)(uint)local_12a8 <= iVar24;
                          iVar24 = iVar26;
                        } while (bVar7);
                        iVar26 = iVar26 + iVar20;
LAB_0010cb9b:
                        local_12b8[iVar26] = (UInt32)local_12a0;
                        lVar16 = local_1298 + 3;
                        local_127c = local_127c + 3;
                        local_1280 = local_1280 + 3;
                        local_1284 = local_1284 + 3;
                        pUVar23 = local_12b8;
                        lVar19 = local_1270;
                        if (local_12bc < 0) goto LAB_0010cbe5;
                      }
                    } while (1 < (long)local_11f0);
                  }
                }
LAB_0010cbe5:
                uVar12 = (uint)local_1250;
                pbVar37 = local_12b0;
                if (-1 < local_12bc) goto LAB_0010cd8c;
                break;
              }
              lVar16 = (long)(int)uVar12;
              bVar28 = pbVar37[pUVar23[lVar16] + iVar11];
              bVar3 = pbVar37[pUVar23[lVar19] + iVar11];
              uVar40 = (uint)bVar3;
              if (bVar3 < bVar28) {
                uVar40 = (uint)bVar28;
              }
              bVar4 = pbVar37[pUVar23[(int)(uVar9 + uVar12) >> 1] + iVar11];
              uVar41 = (uint)bVar3;
              if (bVar28 < bVar3) {
                uVar41 = (uint)bVar28;
              }
              if ((byte)uVar41 <= bVar4) {
                uVar41 = (uint)bVar4;
              }
              if ((byte)uVar40 <= bVar4) {
                uVar41 = uVar40;
              }
              uVar32 = (ulong)uVar41;
              uVar17 = (ulong)uVar9;
              uVar39 = local_1268;
              uVar18 = local_1268;
              uVar40 = uVar9;
LAB_0010c82c:
              uVar34 = (uint)uVar18;
              bVar28 = (byte)uVar41;
              if ((int)uVar34 <= (int)uVar40) {
                uVar39 = (ulong)(int)uVar39;
                do {
                  uVar36 = (uint)uVar18;
                  lVar19 = (long)(int)uVar36 + -1;
                  while( true ) {
                    UVar10 = pUVar23[lVar19 + 1];
                    uVar34 = (uint)uVar18;
                    if (local_12b0[UVar10 + iVar11] == bVar28) break;
                    pbVar37 = local_12b0;
                    if (bVar28 < local_12b0[UVar10 + iVar11]) goto LAB_0010c893;
                    uVar18 = (ulong)(uVar34 + 1);
                    lVar19 = lVar19 + 1;
                    if ((int)uVar40 <= lVar19) {
                      if ((int)uVar36 <= (int)uVar40) {
                        uVar36 = uVar40;
                      }
                      uVar34 = uVar36 + 1;
                      goto LAB_0010c893;
                    }
                  }
                  pUVar23[lVar19 + 1] = pUVar23[uVar39];
                  pUVar23[uVar39] = UVar10;
                  uVar39 = uVar39 + 1;
                  uVar18 = (ulong)(uVar34 + 1);
                } while ((int)uVar34 < (int)uVar40);
                uVar34 = uVar34 + 1;
                pbVar37 = local_12b0;
              }
LAB_0010c893:
              if ((int)uVar34 <= (int)uVar40) {
                lVar19 = (long)(int)uVar34;
                uVar17 = (ulong)(int)uVar17;
                do {
                  lVar13 = (long)(int)uVar40 + 1;
                  uVar36 = uVar40;
                  while( true ) {
                    UVar10 = pUVar23[lVar13 + -1];
                    if (local_12b0[UVar10 + iVar11] == bVar28) break;
                    if (local_12b0[UVar10 + iVar11] < bVar28) {
                      UVar5 = local_12b8[lVar19];
                      local_12b8[lVar19] = UVar10;
                      local_12b8[lVar13 + -1] = UVar5;
                      uVar40 = uVar36 - 1;
                      uVar18 = (ulong)(uVar34 + 1);
                      pUVar23 = local_12b8;
                      pbVar37 = local_12b0;
                      goto LAB_0010c82c;
                    }
                    lVar13 = lVar13 + -1;
                    uVar36 = uVar36 - 1;
                    if (lVar13 <= lVar19) {
                      uVar41 = uVar34;
                      if ((int)uVar40 < lVar19) {
                        uVar41 = uVar40;
                      }
                      uVar40 = uVar41 - 1;
                      pbVar37 = local_12b0;
                      goto LAB_0010c93e;
                    }
                  }
                  local_12b8[lVar13 + -1] = local_12b8[uVar17];
                  local_12b8[uVar17] = UVar10;
                  uVar17 = uVar17 - 1;
                  uVar40 = uVar36 - 1;
                  pUVar23 = local_12b8;
                } while ((int)uVar34 < (int)uVar36);
                uVar40 = uVar36 - 1;
                pbVar37 = local_12b0;
              }
LAB_0010c93e:
              iVar20 = (int)uVar17;
              iVar24 = (int)uVar39;
              if (iVar20 < iVar24) goto code_r0x0010c94e;
              iVar26 = uVar34 - iVar24;
              if ((int)(iVar24 - uVar12) < (int)(uVar34 - iVar24)) {
                iVar26 = iVar24 - uVar12;
              }
              if (0 < iVar26) {
                iVar30 = iVar26 + 1;
                lVar19 = 0;
                do {
                  uVar6 = *(undefined4 *)((long)local_12b8 + lVar19 + lVar16 * 4);
                  *(undefined4 *)((long)local_12b8 + lVar19 + lVar16 * 4) =
                       *(undefined4 *)((long)local_12b8 + lVar19 + (long)(int)(uVar34 - iVar26) * 4)
                  ;
                  *(undefined4 *)((long)local_12b8 + lVar19 + (long)(int)(uVar34 - iVar26) * 4) =
                       uVar6;
                  lVar19 = lVar19 + 4;
                  iVar30 = iVar30 + -1;
                } while (1 < iVar30);
              }
              iVar30 = iVar20 - uVar40;
              iVar26 = uVar9 - iVar20;
              if (iVar30 <= (int)(uVar9 - iVar20)) {
                iVar26 = iVar30;
              }
              if (0 < iVar26) {
                iVar20 = iVar26 + 1;
                pUVar21 = local_12b8;
                do {
                  UVar10 = pUVar21[(int)uVar34];
                  pUVar21[(int)uVar34] = pUVar21[(long)(int)(uVar9 - iVar26) + 1];
                  pUVar21[(long)(int)(uVar9 - iVar26) + 1] = UVar10;
                  pUVar21 = pUVar21 + 1;
                  iVar20 = iVar20 + -1;
                } while (1 < iVar20);
              }
              uVar31 = ((uVar12 - iVar24) + uVar34) - 1;
              uVar41 = uVar9 - iVar30;
              uVar40 = uVar41 + 1;
              uVar36 = uVar9;
              uVar27 = uVar12;
              if ((int)(uVar31 - uVar12) < (int)(uVar9 - uVar40)) {
                uVar36 = uVar31;
                uVar31 = uVar9;
                uVar27 = uVar40;
                uVar40 = uVar12;
              }
              uVar34 = (uVar12 - iVar24) + uVar34;
              uVar12 = uVar36;
              uVar9 = uVar40;
              iVar24 = iVar11 + 1;
              iVar20 = iVar11;
              if ((int)(uVar36 - uVar40) < (int)(uVar41 - uVar34)) {
                uVar12 = uVar41;
                uVar9 = uVar34;
                iVar24 = iVar11;
                uVar34 = uVar40;
                iVar20 = iVar11 + 1;
                uVar41 = uVar36;
              }
              uVar32 = (ulong)uVar41;
              uVar40 = uVar31;
              uVar36 = uVar27;
              iVar26 = iVar20;
              if ((int)(uVar31 - uVar27) < (int)(uVar12 - uVar9)) {
                uVar40 = uVar12;
                uVar36 = uVar9;
                iVar26 = iVar11;
                iVar11 = iVar20;
                uVar9 = uVar27;
                uVar12 = uVar31;
              }
              local_dc8[local_1250] = uVar36;
              local_f58[local_1250] = uVar40;
              local_10e8[local_1250] = iVar11;
              uVar39 = local_12a8 & 0xffffffff;
              local_dc8[uVar39] = uVar9;
              local_f58[uVar39] = uVar12;
              local_10e8[uVar39] = iVar26;
              local_dc8[uVar39 + 1] = uVar34;
              local_f58[uVar39 + 1] = uVar41;
              local_10e8[uVar39 + 1] = iVar24;
              uVar12 = (int)local_12a8 + 2;
              pUVar23 = local_12b8;
LAB_0010cd8c:
              local_12a8 = (ulong)uVar12;
              bVar7 = 0 < (int)uVar12;
            } while (0 < (int)uVar12);
LAB_0010cda0:
            in_R8D = (Int32)uVar32;
            uVar12 = (uint)local_1290;
            uVar18 = local_1200;
            pUVar25 = local_1208;
            uVar17 = local_11f8;
            pUVar21 = local_1220;
            uVar39 = local_1290;
            if (local_12bc < 0) goto LAB_0010d01a;
          }
          pbVar2 = (byte *)((long)pUVar25 + uVar17 * 4 + 2);
          *pbVar2 = *pbVar2 | 0x20;
        }
        uVar12 = (uint)uVar39;
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0x100);
      lVar19 = (long)(int)uVar18;
      if (local_11e8[lVar19] != '\0') {
        bz_internal_error(0x3ee);
      }
      puVar15 = local_1210 + lVar19;
      lVar16 = 0;
      do {
        auStack_438[lVar16] = puVar15[-1] & 0xffdfffff;
        auStack_c38[lVar16 + 0x100] = (*puVar15 & 0xffdfffff) - 1;
        lVar16 = lVar16 + 1;
        puVar15 = puVar15 + 0x100;
      } while (lVar16 != 0x100);
      uVar18 = (long)(int)pUVar21[local_1230] & 0xffffffffffdfffff;
      uVar9 = auStack_438[lVar19];
      if ((int)uVar18 < (int)uVar9) {
        do {
          UVar10 = (pUVar23[uVar18] + ((int)(pUVar23[uVar18] - 1) >> 0x1f & uVar12)) - 1;
          bVar28 = pbVar37[(int)UVar10];
          if (local_11e8[bVar28] == '\0') {
            uVar9 = auStack_438[bVar28];
            auStack_438[bVar28] = uVar9 + 1;
            pUVar23[(int)uVar9] = UVar10;
          }
          uVar18 = uVar18 + 1;
          uVar9 = auStack_438[lVar19];
        } while ((long)uVar18 < (long)(int)uVar9);
      }
      iVar11 = local_1244 + 0x100;
      iVar20 = (pUVar21[iVar11] & 0xffdfffff) - 1;
      uVar40 = auStack_c38[lVar19 + 0x100];
      if ((int)uVar40 < iVar20) {
        lVar16 = (long)iVar20;
        do {
          UVar10 = (pUVar23[lVar16] + ((int)(pUVar23[lVar16] - 1) >> 0x1f & uVar12)) - 1;
          uVar18 = (ulong)pbVar37[(int)UVar10];
          if (local_11e8[uVar18] == '\0') {
            uVar40 = auStack_c38[uVar18 + 0x100];
            uVar41 = uVar40 - 1;
            uVar32 = (ulong)uVar41;
            auStack_c38[uVar18 + 0x100] = uVar41;
            pUVar23[(int)uVar40] = UVar10;
          }
          lVar16 = lVar16 + -1;
          uVar40 = auStack_c38[lVar19 + 0x100];
        } while ((int)uVar40 < lVar16);
      }
      if ((uVar9 - 1 != uVar40) && ((uVar9 != 0 || (uVar40 != (uint)local_1238)))) {
        bz_internal_error(0x3ef);
      }
      lVar16 = 0;
      do {
        pbVar2 = (byte *)((long)pUVar21 + lVar16 + lVar19 * 4 + 2);
        *pbVar2 = *pbVar2 | 0x20;
        lVar16 = lVar16 + 0x400;
      } while (lVar16 != 0x40000);
      local_11e8[lVar19] = '\x01';
      if (local_1278 != 0xff) {
        UVar10 = pUVar21[local_1230];
        uVar9 = (pUVar21[iVar11] & 0xffdfffff) - (int)((long)(int)UVar10 & 0xffffffffffdfffffU);
        bVar28 = 0xff;
        do {
          bVar28 = bVar28 + 1;
        } while (0xfffe < (int)uVar9 >> (bVar28 & 0x1f));
        if (0 < (int)uVar9) {
          uVar18 = (ulong)uVar9;
          do {
            UVar5 = local_1218[((long)(int)UVar10 & 0xffffffffffdfffffU) + uVar18];
            uVar40 = (uint)(uVar18 - 1) >> (bVar28 & 0x1f);
            uVar32 = (ulong)uVar40;
            UVar29 = (UInt16)uVar40;
            local_1260[(int)UVar5] = UVar29;
            if ((long)(int)UVar5 < 0x22) {
              local_1260[(int)(UVar5 + uVar12)] = UVar29;
            }
            bVar7 = 1 < (long)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar7);
        }
        if (0xffff < (int)(uVar9 - 1) >> (bVar28 & 0x1f)) {
          bz_internal_error(0x3ea);
        }
      }
      in_R8D = (Int32)uVar32;
      local_1278 = local_1278 + 1;
    } while (local_1278 != 0x100);
LAB_0010d01a:
    pEVar22 = local_1258;
    if (-1 < local_12bc) goto LAB_0010d039;
    pUVar25 = local_1258->arr1;
    eclass = local_1258->arr2;
  }
  pEVar22 = local_1258;
  fallbackSort(pUVar25,eclass,pUVar21,uVar12,in_R8D);
LAB_0010d039:
  pEVar22->origPtr = -1;
  if (0 < (long)pEVar22->nblock) {
    lVar19 = 0;
    do {
      if (pUVar23[lVar19] == 0) {
        local_1258->origPtr = (Int32)lVar19;
        break;
      }
      lVar19 = lVar19 + 1;
    } while (pEVar22->nblock != lVar19);
  }
  if (local_1258->origPtr == -1) {
    bz_internal_error(0x3eb);
    return;
  }
  return;
code_r0x0010c94e:
  local_10e8[local_1250] = iVar11 + 1;
  if (!bVar7) goto LAB_0010cda0;
  goto LAB_0010c78e;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}